

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O1

StatusOr<bool> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetBool(UnparseProto3Type *this,Field f)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  char *pcVar2;
  StatusOr<bool> SVar3;
  Status local_98;
  AlphaNum local_90;
  AlphaNum local_40;
  
  pcVar2 = (char *)((ulong)(f->raw_->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
  if (*(long *)(pcVar2 + 8) == 0) {
LAB_002dc2d4:
    this[8] = (UnparseProto3Type)0x0;
  }
  else {
    iVar1 = std::__cxx11::string::compare(pcVar2);
    in_RDX = extraout_RDX;
    if (iVar1 == 0) goto LAB_002dc2d4;
    iVar1 = std::__cxx11::string::compare
                      ((char *)((ulong)(f->raw_->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc));
    if (iVar1 != 0) {
      local_40.piece_._M_len = 0x21;
      local_40.piece_._M_str = "bad default value in type.proto: ";
      pcVar2 = (char *)((ulong)(f->parent_->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc);
      local_90.digits_._24_8_ = *(undefined8 *)pcVar2;
      local_90.digits_._16_8_ = *(undefined8 *)(pcVar2 + 8);
      absl::lts_20240722::StrCat_abi_cxx11_(&local_90,&local_40);
      absl::lts_20240722::InternalError(&local_98,local_90.piece_._M_str,local_90.piece_._M_len);
      absl::lts_20240722::internal_statusor::StatusOrData<bool>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<bool> *)this,&local_98);
      in_RDX = extraout_RDX_01;
      if ((local_98.rep_ & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
        in_RDX = extraout_RDX_02;
      }
      if ((char *)local_90.piece_._M_len != local_90.digits_) {
        operator_delete((void *)local_90.piece_._M_len,local_90.digits_._0_8_ + 1);
        in_RDX = extraout_RDX_03;
      }
      goto LAB_002dc2df;
    }
    this[8] = (UnparseProto3Type)0x1;
    in_RDX = extraout_RDX_00;
  }
  *(undefined8 *)this = 1;
LAB_002dc2df:
  SVar3.super_StatusOrData<bool>._8_8_ = in_RDX;
  SVar3.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)this;
  return (StatusOr<bool>)SVar3.super_StatusOrData<bool>;
}

Assistant:

static absl::StatusOr<bool> GetBool(Field f) {
    if (f->proto().default_value().empty()) {
      return false;
    } else if (f->proto().default_value() == "false") {
      return false;
    } else if (f->proto().default_value() == "true") {
      return true;
    } else {
      return absl::InternalError(absl::StrCat(
          "bad default value in type.proto: ", f->parent().proto().name()));
    }
  }